

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_shr_int(secp256k1_scalar *r,int n)

{
  uint64_t uVar1;
  byte bVar2;
  int ret;
  int n_local;
  secp256k1_scalar *r_local;
  
  uVar1 = r->d[0];
  bVar2 = (byte)n;
  r->d[0] = (r->d[0] >> (bVar2 & 0x3f)) + (r->d[1] << (0x40 - bVar2 & 0x3f));
  r->d[1] = (r->d[1] >> (bVar2 & 0x3f)) + (r->d[2] << (0x40 - bVar2 & 0x3f));
  r->d[2] = (r->d[2] >> (bVar2 & 0x3f)) + (r->d[3] << (0x40 - bVar2 & 0x3f));
  r->d[3] = r->d[3] >> (bVar2 & 0x3f);
  return (uint)uVar1 & (1 << (bVar2 & 0x1f)) - 1U;
}

Assistant:

static int secp256k1_scalar_shr_int(secp256k1_scalar *r, int n) {
    int ret;
    VERIFY_CHECK(n > 0);
    VERIFY_CHECK(n < 16);
    ret = r->d[0] & ((1 << n) - 1);
    r->d[0] = (r->d[0] >> n) + (r->d[1] << (64 - n));
    r->d[1] = (r->d[1] >> n) + (r->d[2] << (64 - n));
    r->d[2] = (r->d[2] >> n) + (r->d[3] << (64 - n));
    r->d[3] = (r->d[3] >> n);
    return ret;
}